

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsParticle_dns.c
# Opt level: O2

int ComputeError(sunrealtype t,N_Vector y,N_Vector e,sunrealtype *ec,UserData udata)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  int retval;
  
  pdVar2 = (double *)N_VGetArrayPointer();
  pdVar3 = (double *)N_VGetArrayPointer(e);
  dVar4 = cos(udata->alpha * t);
  *pdVar3 = dVar4;
  dVar4 = sin(t * udata->alpha);
  pdVar3[1] = dVar4;
  retval = 0;
  iVar1 = check_retval(&retval,"ComputeSolution",1);
  if (iVar1 == 0) {
    N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,y,e,e);
    *ec = *pdVar2 * *pdVar2 + pdVar2[1] * pdVar2[1] + -1.0;
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int ComputeError(sunrealtype t, N_Vector y, N_Vector e, sunrealtype* ec,
                        UserData udata)
{
  sunrealtype* ydata = N_VGetArrayPointer(y);
  int retval;

  /* solution error */
  retval = ComputeSolution(t, e, udata);
  if (check_retval(&retval, "ComputeSolution", 1)) { return (1); }
  N_VLinearSum(ONE, y, -ONE, e, e);

  /* constraint error */
  *ec = ydata[0] * ydata[0] + ydata[1] * ydata[1] - ONE;

  return (0);
}